

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall wallet::SQLiteDatabase::Open(SQLiteDatabase *this)

{
  sqlite3 **ppsVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CChainParams *pCVar6;
  runtime_error *prVar7;
  char **ppcVar8;
  sqlite3_stmt **args;
  Level level;
  sqlite3 *psVar9;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  allocator<char> local_b5;
  uint local_b4;
  sqlite3_stmt *check_main_stmt;
  allocator<char> local_a1;
  string local_a0;
  path local_80;
  path local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ppsVar1 = &this->m_db;
  if (this->m_db == (sqlite3 *)0x0) {
    bVar3 = this->m_mock;
    if (bVar3 == false) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_58,&this->m_dir_path,auto_format);
      std::filesystem::__cxx11::path::path(&local_80,&local_58);
      std::filesystem::__cxx11::path::~path(&local_58);
      TryCreateDirectories((path *)&local_80);
      std::filesystem::__cxx11::path::~path(&local_80);
    }
    ppcVar8 = (char **)0x0;
    iVar4 = sqlite3_open_v2((this->m_file_path)._M_dataplus._M_p,ppsVar1,(uint)bVar3 << 7 | 0x10006)
    ;
    if (iVar4 != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_80._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar4);
      tinyformat::format<char_const*>
                (&local_58._M_pathname,(tinyformat *)"SQLiteDatabase: Failed to open database: %s\n"
                 ,(char *)&local_80,ppcVar8);
      std::runtime_error::runtime_error(prVar7,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00494888;
    }
    psVar9 = *ppsVar1;
    level = Debug;
    iVar4 = sqlite3_extended_result_codes();
    if (iVar4 != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_80._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar4);
      tinyformat::format<char_const*>
                (&local_58._M_pathname,
                 (tinyformat *)"SQLiteDatabase: Failed to enable extended result codes: %s\n",
                 (char *)&local_80,ppcVar8);
      std::runtime_error::runtime_error(prVar7,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00494888;
    }
    bVar3 = ::LogAcceptCategory((LogFlags)psVar9,level);
    if ((bVar3) && (iVar4 = sqlite3_trace_v2(this->m_db,1,TraceSqlCallback,this), iVar4 != 0)) {
      (*(this->super_WalletDatabase)._vptr_WalletDatabase[0xc])(&local_58,this);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file._M_len = 0x61;
      logging_function._M_str = "Open";
      logging_function._M_len = 4;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x10e,ALL,Info,(ConstevalFormatString<1U>)0x6eaac2,
                 &local_58._M_pathname);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  iVar4 = sqlite3_db_readonly(*ppsVar1,"main");
  if (iVar4 == 0) {
    psVar9 = *ppsVar1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"locking_mode",(allocator<char> *)&check_main_stmt);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"exclusive",(allocator<char> *)&local_b4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Unable to change database locking mode to exclusive",&local_a1);
    SetPragma(psVar9,&local_58._M_pathname,&local_80._M_pathname,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_58);
    iVar4 = sqlite3_exec(*ppsVar1,"BEGIN EXCLUSIVE TRANSACTION",0,0,0);
    if (iVar4 == 0) {
      ppcVar8 = (char **)0x0;
      iVar4 = sqlite3_exec(*ppsVar1,"COMMIT",0,0,0);
      if (iVar4 == 0) {
        psVar9 = *ppsVar1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"fullfsync",(allocator<char> *)&check_main_stmt);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"true",(allocator<char> *)&local_b4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"Failed to enable fullfsync",&local_a1);
        SetPragma(psVar9,&local_58._M_pathname,&local_80._M_pathname,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_58);
        if (this->m_use_unsafe_sync == true) {
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
          ;
          source_file_00._M_len = 0x61;
          logging_function_00._M_str = "Open";
          logging_function_00._M_len = 4;
          LogPrintFormatInternal<>
                    (logging_function_00,source_file_00,0x129,ALL,Info,
                     (ConstevalFormatString<0U>)0x6eac76);
          psVar9 = *ppsVar1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"synchronous",(allocator<char> *)&check_main_stmt);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"OFF",(allocator<char> *)&local_b4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"Failed to set synchronous mode to OFF",&local_a1);
          SetPragma(psVar9,&local_58._M_pathname,&local_80._M_pathname,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_58);
        }
        args = &check_main_stmt;
        check_main_stmt = (sqlite3_stmt *)0x0;
        iVar4 = sqlite3_prepare_v2(*ppsVar1,
                                   "SELECT name FROM sqlite_master WHERE type=\'table\' AND name=\'main\'"
                                   ,0xffffffffffffffff,args,0);
        if (iVar4 == 0) {
          iVar4 = sqlite3_step(check_main_stmt);
          iVar5 = sqlite3_finalize(check_main_stmt);
          if (iVar5 == 0) {
            if (iVar4 != 100) {
              if (iVar4 != 0x65) {
                prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_80._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar4);
                tinyformat::format<char_const*>
                          (&local_58._M_pathname,
                           (tinyformat *)
                           "SQLiteDatabase: Failed to execute statement to check table existence: %s\n"
                           ,(char *)&local_80,(char **)args);
                std::runtime_error::runtime_error(prVar7,(string *)&local_58);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                  __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_00494888;
              }
              ppcVar8 = (char **)0x0;
              iVar4 = sqlite3_exec(*ppsVar1,
                                   "CREATE TABLE main(key BLOB PRIMARY KEY NOT NULL, value BLOB NOT NULL)"
                                   ,0,0,0);
              if (iVar4 != 0) {
                prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_80._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar4);
                tinyformat::format<char_const*>
                          (&local_58._M_pathname,
                           (tinyformat *)"SQLiteDatabase: Failed to create new database: %s\n",
                           (char *)&local_80,ppcVar8);
                std::runtime_error::runtime_error(prVar7,(string *)&local_58);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                  __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_00494888;
              }
              pCVar6 = Params();
              uVar2 = *(uint *)(pCVar6->pchMessageStart)._M_elems;
              psVar9 = *ppsVar1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_58,"application_id",&local_a1);
              local_b4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                         uVar2 << 0x18;
              tinyformat::format<int>(&local_80._M_pathname,"%d",(int *)&local_b4);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a0,"Failed to set the application id",&local_b5);
              SetPragma(psVar9,&local_58._M_pathname,&local_80._M_pathname,&local_a0);
              std::__cxx11::string::~string((string *)&local_a0);
              std::__cxx11::string::~string((string *)&local_80);
              std::__cxx11::string::~string((string *)&local_58);
              psVar9 = *ppsVar1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_58,"user_version",(allocator<char> *)&local_b4);
              tinyformat::format<int>(&local_80._M_pathname,"%d",&WALLET_SCHEMA_VERSION);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a0,"Failed to set the wallet schema version",&local_a1);
              SetPragma(psVar9,&local_58._M_pathname,&local_80._M_pathname,&local_a0);
              std::__cxx11::string::~string((string *)&local_a0);
              std::__cxx11::string::~string((string *)&local_80);
              std::__cxx11::string::~string((string *)&local_58);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
              return;
            }
          }
          else {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_80._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar4);
            tinyformat::format<char_const*>
                      (&local_58._M_pathname,
                       (tinyformat *)
                       "SQLiteDatabase: Failed to finalize statement checking table existence: %s\n"
                       ,(char *)&local_80,(char **)args);
            std::runtime_error::runtime_error(prVar7,(string *)&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        else {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_80._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar4);
          tinyformat::format<char_const*>
                    (&local_58._M_pathname,
                     (tinyformat *)
                     "SQLiteDatabase: Failed to prepare statement to check table existence: %s\n",
                     (char *)&local_80,(char **)args);
          std::runtime_error::runtime_error(prVar7,(string *)&local_58);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      else {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_80._M_pathname._M_dataplus._M_p = (pointer)sqlite3_errstr(iVar4);
        tinyformat::format<char_const*>
                  (&local_58._M_pathname,
                   (tinyformat *)"SQLiteDatabase: Unable to end exclusive lock transaction: %s\n",
                   (char *)&local_80,ppcVar8);
        std::runtime_error::runtime_error(prVar7,(string *)&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    else {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar7,
                 "SQLiteDatabase: Unable to obtain an exclusive lock on the database, is it being used by another instance of Bitcoin Core?\n"
                );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) goto LAB_00494302;
    }
  }
  else {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar7,
               "SQLiteDatabase: Database opened in readonly mode but read-write permissions are needed"
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
LAB_00494302:
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_00494888:
  __stack_chk_fail();
}

Assistant:

void SQLiteDatabase::Open()
{
    int flags = SQLITE_OPEN_FULLMUTEX | SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE;
    if (m_mock) {
        flags |= SQLITE_OPEN_MEMORY; // In memory database for mock db
    }

    if (m_db == nullptr) {
        if (!m_mock) {
            TryCreateDirectories(fs::PathFromString(m_dir_path));
        }
        int ret = sqlite3_open_v2(m_file_path.c_str(), &m_db, flags, nullptr);
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to open database: %s\n", sqlite3_errstr(ret)));
        }
        ret = sqlite3_extended_result_codes(m_db, 1);
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to enable extended result codes: %s\n", sqlite3_errstr(ret)));
        }
        // Trace SQL statements if tracing is enabled with -debug=walletdb -loglevel=walletdb:trace
        if (LogAcceptCategory(BCLog::WALLETDB, BCLog::Level::Trace)) {
           ret = sqlite3_trace_v2(m_db, SQLITE_TRACE_STMT, TraceSqlCallback, this);
           if (ret != SQLITE_OK) {
               LogPrintf("Failed to enable SQL tracing for %s\n", Filename());
           }
        }
    }

    if (sqlite3_db_readonly(m_db, "main") != 0) {
        throw std::runtime_error("SQLiteDatabase: Database opened in readonly mode but read-write permissions are needed");
    }

    // Acquire an exclusive lock on the database
    // First change the locking mode to exclusive
    SetPragma(m_db, "locking_mode", "exclusive", "Unable to change database locking mode to exclusive");
    // Now begin a transaction to acquire the exclusive lock. This lock won't be released until we close because of the exclusive locking mode.
    int ret = sqlite3_exec(m_db, "BEGIN EXCLUSIVE TRANSACTION", nullptr, nullptr, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error("SQLiteDatabase: Unable to obtain an exclusive lock on the database, is it being used by another instance of " PACKAGE_NAME "?\n");
    }
    ret = sqlite3_exec(m_db, "COMMIT", nullptr, nullptr, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Unable to end exclusive lock transaction: %s\n", sqlite3_errstr(ret)));
    }

    // Enable fullfsync for the platforms that use it
    SetPragma(m_db, "fullfsync", "true", "Failed to enable fullfsync");

    if (m_use_unsafe_sync) {
        // Use normal synchronous mode for the journal
        LogPrintf("WARNING SQLite is configured to not wait for data to be flushed to disk. Data loss and corruption may occur.\n");
        SetPragma(m_db, "synchronous", "OFF", "Failed to set synchronous mode to OFF");
    }

    // Make the table for our key-value pairs
    // First check that the main table exists
    sqlite3_stmt* check_main_stmt{nullptr};
    ret = sqlite3_prepare_v2(m_db, "SELECT name FROM sqlite_master WHERE type='table' AND name='main'", -1, &check_main_stmt, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to prepare statement to check table existence: %s\n", sqlite3_errstr(ret)));
    }
    ret = sqlite3_step(check_main_stmt);
    if (sqlite3_finalize(check_main_stmt) != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to finalize statement checking table existence: %s\n", sqlite3_errstr(ret)));
    }
    bool table_exists;
    if (ret == SQLITE_DONE) {
        table_exists = false;
    } else if (ret == SQLITE_ROW) {
        table_exists = true;
    } else {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to execute statement to check table existence: %s\n", sqlite3_errstr(ret)));
    }

    // Do the db setup things because the table doesn't exist only when we are creating a new wallet
    if (!table_exists) {
        ret = sqlite3_exec(m_db, "CREATE TABLE main(key BLOB PRIMARY KEY NOT NULL, value BLOB NOT NULL)", nullptr, nullptr, nullptr);
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to create new database: %s\n", sqlite3_errstr(ret)));
        }

        // Set the application id
        uint32_t app_id = ReadBE32(Params().MessageStart().data());
        SetPragma(m_db, "application_id", strprintf("%d", static_cast<int32_t>(app_id)),
                  "Failed to set the application id");

        // Set the user version
        SetPragma(m_db, "user_version", strprintf("%d", WALLET_SCHEMA_VERSION),
                  "Failed to set the wallet schema version");
    }
}